

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  string *in_RDI;
  allocator local_11;
  
  pcVar1 = FLAGS_gtest_output_abi_cxx11_;
  pcVar2 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_11);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}